

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void codeAttach(Parse *pParse,int type,FuncDef *pFunc,Expr *pAuthArg,Expr *pFilename,Expr *pDbname,
               Expr *pKey)

{
  sqlite3 *db_00;
  int target;
  Vdbe *p;
  char *local_98;
  char *zAuthArg;
  int regArgs;
  sqlite3 *db;
  Vdbe *v;
  NameContext sName;
  int rc;
  Expr *pDbname_local;
  Expr *pFilename_local;
  Expr *pAuthArg_local;
  FuncDef *pFunc_local;
  int type_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (pParse->nErr == 0) {
    memset(&v,0,0x38);
    v = (Vdbe *)pParse;
    sName.pWinSelect._4_4_ = resolveAttachExpr((NameContext *)&v,pFilename);
    if (((sName.pWinSelect._4_4_ == 0) &&
        (sName.pWinSelect._4_4_ = resolveAttachExpr((NameContext *)&v,pDbname),
        sName.pWinSelect._4_4_ == 0)) &&
       (sName.pWinSelect._4_4_ = resolveAttachExpr((NameContext *)&v,pKey),
       sName.pWinSelect._4_4_ == 0)) {
      if (pAuthArg != (Expr *)0x0) {
        if (pAuthArg->op == 'n') {
          local_98 = (pAuthArg->u).zToken;
        }
        else {
          local_98 = (char *)0x0;
        }
        sName.pWinSelect._4_4_ = sqlite3AuthCheck(pParse,type,local_98,(char *)0x0,(char *)0x0);
        if (sName.pWinSelect._4_4_ != 0) goto LAB_0026088d;
      }
      p = sqlite3GetVdbe(pParse);
      target = sqlite3GetTempRange(pParse,4);
      sqlite3ExprCode(pParse,pFilename,target);
      sqlite3ExprCode(pParse,pDbname,target + 1);
      sqlite3ExprCode(pParse,pKey,target + 2);
      if (p != (Vdbe *)0x0) {
        sqlite3VdbeAddOp4(p,0x3f,0,(target + 3) - (int)pFunc->nArg,target + 3,&pFunc->nArg,-8);
        sqlite3VdbeChangeP5(p,(ushort)(byte)pFunc->nArg);
        sqlite3VdbeAddOp1(p,0x9e,(uint)(type == 0x18));
      }
    }
  }
LAB_0026088d:
  sqlite3ExprDelete(db_00,pFilename);
  sqlite3ExprDelete(db_00,pDbname);
  sqlite3ExprDelete(db_00,pKey);
  return;
}

Assistant:

static void codeAttach(
  Parse *pParse,       /* The parser context */
  int type,            /* Either SQLITE_ATTACH or SQLITE_DETACH */
  FuncDef const *pFunc,/* FuncDef wrapper for detachFunc() or attachFunc() */
  Expr *pAuthArg,      /* Expression to pass to authorization callback */
  Expr *pFilename,     /* Name of database file */
  Expr *pDbname,       /* Name of the database to use internally */
  Expr *pKey           /* Database key for encryption extension */
){
  int rc;
  NameContext sName;
  Vdbe *v;
  sqlite3* db = pParse->db;
  int regArgs;

  if( pParse->nErr ) goto attach_end;
  memset(&sName, 0, sizeof(NameContext));
  sName.pParse = pParse;

  if( 
      SQLITE_OK!=(rc = resolveAttachExpr(&sName, pFilename)) ||
      SQLITE_OK!=(rc = resolveAttachExpr(&sName, pDbname)) ||
      SQLITE_OK!=(rc = resolveAttachExpr(&sName, pKey))
  ){
    goto attach_end;
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( pAuthArg ){
    char *zAuthArg;
    if( pAuthArg->op==TK_STRING ){
      zAuthArg = pAuthArg->u.zToken;
    }else{
      zAuthArg = 0;
    }
    rc = sqlite3AuthCheck(pParse, type, zAuthArg, 0, 0);
    if(rc!=SQLITE_OK ){
      goto attach_end;
    }
  }
#endif /* SQLITE_OMIT_AUTHORIZATION */


  v = sqlite3GetVdbe(pParse);
  regArgs = sqlite3GetTempRange(pParse, 4);
  sqlite3ExprCode(pParse, pFilename, regArgs);
  sqlite3ExprCode(pParse, pDbname, regArgs+1);
  sqlite3ExprCode(pParse, pKey, regArgs+2);

  assert( v || db->mallocFailed );
  if( v ){
    sqlite3VdbeAddOp4(v, OP_Function0, 0, regArgs+3-pFunc->nArg, regArgs+3,
                      (char *)pFunc, P4_FUNCDEF);
    assert( pFunc->nArg==-1 || (pFunc->nArg&0xff)==pFunc->nArg );
    sqlite3VdbeChangeP5(v, (u8)(pFunc->nArg));
 
    /* Code an OP_Expire. For an ATTACH statement, set P1 to true (expire this
    ** statement only). For DETACH, set it to false (expire all existing
    ** statements).
    */
    sqlite3VdbeAddOp1(v, OP_Expire, (type==SQLITE_ATTACH));
  }
  
attach_end:
  sqlite3ExprDelete(db, pFilename);
  sqlite3ExprDelete(db, pDbname);
  sqlite3ExprDelete(db, pKey);
}